

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pragmaVtabNext(sqlite3_vtab_cursor *pVtabCursor)

{
  int iVar1;
  PragmaVtabCursor *in_RDI;
  int rc;
  PragmaVtabCursor *pCsr;
  sqlite3_stmt *in_stack_00000018;
  int local_14;
  PragmaVtabCursor *pStmt;
  
  local_14 = 0;
  in_RDI->iRowid = in_RDI->iRowid + 1;
  pStmt = in_RDI;
  iVar1 = sqlite3_step(in_stack_00000018);
  if (iVar1 != 100) {
    local_14 = sqlite3_finalize((sqlite3_stmt *)pStmt);
    in_RDI->pPragma = (sqlite3_stmt *)0x0;
    pragmaVtabCursorClear(in_RDI);
  }
  return local_14;
}

Assistant:

static int pragmaVtabNext(sqlite3_vtab_cursor *pVtabCursor){
  PragmaVtabCursor *pCsr = (PragmaVtabCursor*)pVtabCursor;
  int rc = SQLITE_OK;

  /* Increment the xRowid value */
  pCsr->iRowid++;
  assert( pCsr->pPragma );
  if( SQLITE_ROW!=sqlite3_step(pCsr->pPragma) ){
    rc = sqlite3_finalize(pCsr->pPragma);
    pCsr->pPragma = 0;
    pragmaVtabCursorClear(pCsr);
  }
  return rc;
}